

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testKeepAlives(StringRef *addrString)

{
  bool bVar1;
  int iVar2;
  C *pCVar3;
  socklen_t __len;
  dword_t *p;
  sockaddr *__addr;
  char *__format;
  Socket socket;
  dword_t delay;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_60;
  dword_t value;
  SockAddr addr;
  
  value = 1;
  delay = 3;
  socket.m_socket.super_File.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h
       = (Socket)(File)0xffffffff;
  printf("Opening a TCP socket (%d sec keep-alives)...\n",3);
  iVar2 = axl::io::psx::Socket::open(&socket.m_socket,(char *)0x2,1,6);
  if ((((char)iVar2 != '\0') &&
      (bVar1 = axl::io::psx::Socket::setOption(&socket.m_socket,1,9,&value,4), bVar1)) &&
     (bVar1 = axl::io::psx::Socket::setOption(&socket.m_socket,6,4,&delay,4), bVar1)) {
    p = &delay;
    bVar1 = axl::io::psx::Socket::setOption(&socket.m_socket,6,5,p,4);
    __len = (socklen_t)p;
    if (bVar1) {
      pCVar3 = axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(addrString);
      printf("Parsing address \'%s\'...\n",pCVar3);
      addr.field_0._16_4_ = 0;
      addr.field_0._20_8_ = 0;
      addr.field_0._0_8_ = 0;
      addr.field_0._8_4_ = 0;
      addr.field_0._12_4_ = 0;
      bVar1 = axl::io::SockAddr::parse(&addr,addrString);
      if (bVar1) {
        axl::io::getSockAddrString((String *)&local_60,(sockaddr *)&addr);
        pCVar3 = local_60.m_p;
        if (local_60.m_length == 0) {
          pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
        }
        printf("Connecting to %s...\n",pCVar3);
        axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_60);
        iVar2 = axl::io::psx::Socket::connect(&socket.m_socket,(int)&addr,__addr,__len);
        if ((char)iVar2 != '\0') {
          puts("Press CTRL+C to exit...");
          do {
            axl::sys::sleep(1000);
          } while( true );
        }
        axl::err::getLastErrorDescription();
        if (local_60.m_length == 0) {
          local_60.m_p = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
        }
        __format = "socket.connect failed (%s)\n";
      }
      else {
        axl::err::getLastErrorDescription();
        if (local_60.m_length == 0) {
          local_60.m_p = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
        }
        __format = "addr.parse failed (%s)\n";
      }
      goto LAB_0010cd56;
    }
  }
  axl::err::getLastErrorDescription();
  if (local_60.m_length == 0) {
    local_60.m_p = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  __format = "socket.open failed (%s)\n";
LAB_0010cd56:
  printf(__format,local_60.m_p);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_60);
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&socket);
  return;
}

Assistant:

void
testKeepAlives(const sl::StringRef& addrString) {
	dword_t value = 1;
	dword_t delay = 3;

	io::Socket socket;

	printf("Opening a TCP socket (%d sec keep-alives)...\n", delay);

	bool result =
		socket.open(AF_INET, SOCK_STREAM, IPPROTO_TCP) &&
		socket.setOption(SOL_SOCKET, SO_KEEPALIVE, &value, sizeof(value)) &&
		socket.setOption(IPPROTO_TCP, TCP_KEEPIDLE, &delay, sizeof(delay)) &&
		socket.setOption(IPPROTO_TCP, TCP_KEEPINTVL, &delay, sizeof(delay));

	if (!result) {
		printf("socket.open failed (%s)\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("Parsing address '%s'...\n", addrString.sz());

	io::SockAddr addr;
	result = addr.parse(addrString);
	if (!result) {
		printf("addr.parse failed (%s)\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("Connecting to %s...\n", addr.getString().sz());

	result = socket.connect(addr);
	if (!result) {
		printf("socket.connect failed (%s)\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("Press CTRL+C to exit...\n");

	for (;;) {
		sys::sleep(1000);
	}
}